

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O1

SquareMatrix<float> * __thiscall
qclab::dense::SquareMatrix<float>::operator=(SquareMatrix<float> *this,SquareMatrix<float> *matrix)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  long lVar4;
  ulong uVar5;
  
  lVar1 = matrix->size_;
  if (lVar1 != this->size_) {
    this->size_ = lVar1;
    if (lVar1 == 0) {
      __assert_fail("size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/memory.hpp"
                    ,0x12,"auto qclab::dense::alloc_unique_array(const int64_t) [T = float]");
    }
    uVar5 = 0xffffffffffffffff;
    if ((ulong)(lVar1 * lVar1) >> 0x3e == 0) {
      uVar5 = lVar1 * lVar1 * 4;
    }
    pfVar3 = (float *)operator_new__(uVar5);
    pfVar2 = (this->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
             super__Head_base<0UL,_float_*,_false>._M_head_impl;
    (this->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
    super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
    super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar3;
    if (pfVar2 != (float *)0x0) {
      operator_delete__(pfVar2);
    }
  }
  lVar1 = this->size_;
  if (lVar1 != 0) {
    pfVar2 = (matrix->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
             super__Head_base<0UL,_float_*,_false>._M_head_impl;
    pfVar3 = (this->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
             super__Head_base<0UL,_float_*,_false>._M_head_impl;
    lVar4 = 0;
    do {
      pfVar3[lVar4] = pfVar2[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar1 * lVar1 + (ulong)(lVar1 * lVar1 == 0) != lVar4);
  }
  return this;
}

Assistant:

SquareMatrix< T >& operator=( const SquareMatrix< T >& matrix ) {
          if ( matrix.size() != size_ ) {
            size_ = matrix.size() ;
            data_ = std::move( alloc_unique_array< T >( size_ * size_ ) ) ;
          }
          const T* data = matrix.ptr() ;
          #pragma omp parallel for
          for ( int64_t i = 0; i < size_*size_; i++ ) {
            data_[i] = data[i] ;
          }
          return *this ;
        }